

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.cc
# Opt level: O2

bool __thiscall
tchecker::variable_access_map_t::has_shared_variable
          (variable_access_map_t *this,variable_type_t vtype)

{
  vec_iterator<std::pair<std::tuple<unsigned_int,_tchecker::variable_type_t,_tchecker::variable_access_t>,_boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>_>_*,_true>
  vVar1;
  reference ppVar2;
  pointer bg;
  pointer ppVar3;
  const_iterator __begin1;
  vec_iterator<std::pair<std::tuple<unsigned_int,_tchecker::variable_type_t,_tchecker::variable_access_t>,_boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>_>_*,_true>
  local_28;
  
  local_28.m_ptr =
       (pair<std::tuple<unsigned_int,_tchecker::variable_type_t,_tchecker::variable_access_t>,_boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>_>
        *)(this->_v2p_map).m_flat_tree.m_data.m_seq.m_holder.m_start;
  ppVar3 = (pointer)local_28.m_ptr + (this->_v2p_map).m_flat_tree.m_data.m_seq.m_holder.m_size;
  while (vVar1.m_ptr = local_28.m_ptr,
        local_28.m_ptr !=
        (pair<std::tuple<unsigned_int,_tchecker::variable_type_t,_tchecker::variable_access_t>,_boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>_>
         *)ppVar3) {
    ppVar2 = boost::container::
             vec_iterator<std::pair<std::tuple<unsigned_int,_tchecker::variable_type_t,_tchecker::variable_access_t>,_boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>_>_*,_true>
             ::operator*(&local_28);
    if ((1 < (ppVar2->second).
             super_flat_tree<unsigned_int,_boost::move_detail::identity<unsigned_int>,_std::less<unsigned_int>,_void>
             .m_data.m_seq.m_holder.m_size) &&
       ((ppVar2->first).
        super__Tuple_impl<0UL,_unsigned_int,_tchecker::variable_type_t,_tchecker::variable_access_t>
        .super__Tuple_impl<1UL,_tchecker::variable_type_t,_tchecker::variable_access_t>.
        super__Head_base<1UL,_tchecker::variable_type_t,_false>._M_head_impl == vtype)) break;
    boost::container::
    vec_iterator<std::pair<std::tuple<unsigned_int,_tchecker::variable_type_t,_tchecker::variable_access_t>,_boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>_>_*,_true>
    ::operator++(&local_28);
  }
  return vVar1.m_ptr !=
         (pair<std::tuple<unsigned_int,_tchecker::variable_type_t,_tchecker::variable_access_t>,_boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>_>
          *)ppVar3;
}

Assistant:

bool variable_access_map_t::has_shared_variable(enum tchecker::variable_type_t vtype) const
{
  for (auto && v2pid : _v2p_map) {
    if (v2pid.second.size() <= 1)
      continue;
    auto && [id, type, access] = v2pid.first;
    if (type == vtype)
      return true;
  }
  return false;
}